

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linf.c
# Opt level: O0

void linffind(lindef *lin,char *buf,objnum *objp,uint *ofsp)

{
  mcmcxdef *pmVar1;
  mcmcxdef *pmVar2;
  int iVar3;
  unsigned_long uVar4;
  mcmcxdef *pmVar5;
  uchar *puVar6;
  uint *in_RCX;
  undefined2 *in_RDX;
  void *in_RSI;
  long in_RDI;
  uint ofs;
  objnum objn;
  ulong curpos;
  ulong seekpos;
  long cur;
  long last;
  long first;
  uchar *bufptr;
  uchar *objptr;
  uint pg;
  mcmon in_stack_ffffffffffffff7e;
  mcmcxdef *in_stack_ffffffffffffff80;
  mcmcxdef *in_stack_ffffffffffffff88;
  uint local_68;
  undefined2 local_62;
  unsigned_long local_60;
  mcmcxdef *local_48;
  mcmcxdef *local_40;
  
  uVar4 = osrp4(in_RSI);
  local_62 = 0xffff;
  local_68 = 0;
  local_40 = (mcmcxdef *)0x0;
  pmVar1 = (mcmcxdef *)(*(long *)(in_RDI + 0x260) - 1);
  pmVar2 = local_40;
  while( true ) {
    local_40 = pmVar2;
    local_48 = pmVar1;
    if ((long)local_48 < (long)local_40) {
      *in_RDX = local_62;
      *in_RCX = local_68;
      oswp4(in_RSI,local_60);
      return;
    }
    pmVar5 = (mcmcxdef *)((long)local_40->mcmcxmtb + ((long)local_48 - (long)local_40) / 2 + -0x30);
    puVar6 = mcmlck(in_stack_ffffffffffffff88,(mcmon)((ulong)in_stack_ffffffffffffff80 >> 0x30));
    iVar3 = osrp2(puVar6 + ((ulong)pmVar5 & 0x3ff) * 4);
    local_62 = (undefined2)iVar3;
    local_68 = osrp2(puVar6 + ((ulong)pmVar5 & 0x3ff) * 4 + 2);
    mcmunlck(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
    puVar6 = mcmlck(in_stack_ffffffffffffff88,(mcmon)((ulong)in_stack_ffffffffffffff80 >> 0x30));
    local_60 = osrp4(puVar6 + (ulong)local_68 + 5);
    mcmunlck(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7e);
    if (local_60 == uVar4) break;
    if (local_60 < uVar4) {
      in_stack_ffffffffffffff88 = pmVar5;
      pmVar1 = local_48;
      pmVar2 = pmVar5;
      if (pmVar5 == local_40) {
        in_stack_ffffffffffffff88 = (mcmcxdef *)((long)&local_40->mcmcxgl + 1);
        pmVar2 = in_stack_ffffffffffffff88;
      }
    }
    else {
      in_stack_ffffffffffffff80 = pmVar5;
      pmVar1 = pmVar5;
      pmVar2 = local_40;
      if (pmVar5 == local_48) {
        in_stack_ffffffffffffff80 = (mcmcxdef *)((long)local_48[-1].mcmcxmtb + 7);
        pmVar1 = in_stack_ffffffffffffff80;
      }
    }
  }
  *in_RDX = local_62;
  *in_RCX = local_68;
  return;
}

Assistant:

void linffind(lindef *lin, char *buf, objnum *objp, uint *ofsp)
{
#   define  linf ((linfdef *)lin)
    uint    pg;
    uchar  *objptr;
    uchar  *bufptr;
    long    first;
    long    last;
    long    cur;
    ulong   seekpos;
    ulong   curpos;
    objnum  objn;
    uint    ofs;

    /* get desired seek position out of buffer */
    seekpos = osrp4(buf);

    /* we haven't traversed any records yet */
    objn = MCMONINV;
    ofs = 0;
    
    /* run a binary search for the indicated line record */
    first = 0;
    last = linf->linfcrec - 1;
    for (;;)
    {
        /* make sure we're not out of records entirely */
        if (first > last)
        {
            /* return the most recent record found - it's closest */
            *objp = objn;
            *ofsp = ofs;

            /* set the position to that of the line we actually found */
            oswp4(buf, curpos);
            return;
        }

        /* split the difference */
        cur = first + (last - first)/2;

        /* calculate the page containing this item */
        pg = cur >> 10;
        
        /* get object + offset corresponding to current source line */
        objptr = mcmlck(linf->linfmem, linf->linfpg[pg]);
        bufptr = objptr + ((cur & 1023) * DBGLINFSIZ);
        objn = osrp2(bufptr);
        ofs = osrp2(bufptr + 2);
        mcmunlck(linf->linfmem, linf->linfpg[pg]);

        /* read user data out of the object's OPCLINE record */
        objptr = mcmlck(linf->linfmem, (mcmon)objn);
        bufptr = objptr + ofs + 5;
        curpos = osrp4(bufptr);
        mcmunlck(linf->linfmem, (mcmon)objn);

        /* see what we have */
        if (curpos == seekpos)
        {
            *objp = objn;
            *ofsp = ofs;
            return;
        }
        else if (curpos < seekpos)
            first = (cur == first ? first + 1 : cur);
        else
            last = (cur == last ? last - 1 : cur);
    }
    
#   undef linf
}